

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O0

ring_buffer_size_t
PaUtil_GetRingBufferWriteRegions
          (PaUtilRingBuffer *rbuf,ring_buffer_size_t elementCount,void **dataPtr1,
          ring_buffer_size_t *sizePtr1,void **dataPtr2,ring_buffer_size_t *sizePtr2)

{
  void **ppvVar1;
  ulong uVar2;
  long lVar3;
  ring_buffer_size_t firstHalf;
  ring_buffer_size_t available;
  ring_buffer_size_t index;
  ring_buffer_size_t *sizePtr2_local;
  void **dataPtr2_local;
  ring_buffer_size_t *sizePtr1_local;
  void **dataPtr1_local;
  ring_buffer_size_t elementCount_local;
  PaUtilRingBuffer *rbuf_local;
  
  ppvVar1 = (void **)PaUtil_GetRingBufferWriteAvailable(rbuf);
  dataPtr1_local = (void **)elementCount;
  if ((long)ppvVar1 < elementCount) {
    dataPtr1_local = ppvVar1;
  }
  uVar2 = rbuf->writeIndex & rbuf->smallMask;
  if (rbuf->bufferSize < (long)(uVar2 + (long)dataPtr1_local)) {
    lVar3 = rbuf->bufferSize - uVar2;
    *dataPtr1 = rbuf->buffer + uVar2 * rbuf->elementSizeBytes;
    *sizePtr1 = lVar3;
    *dataPtr2 = rbuf->buffer;
    *sizePtr2 = (long)dataPtr1_local - lVar3;
  }
  else {
    *dataPtr1 = rbuf->buffer + uVar2 * rbuf->elementSizeBytes;
    *sizePtr1 = (ring_buffer_size_t)dataPtr1_local;
    *dataPtr2 = (void *)0x0;
    *sizePtr2 = 0;
  }
  return (ring_buffer_size_t)dataPtr1_local;
}

Assistant:

ring_buffer_size_t PaUtil_GetRingBufferWriteRegions( PaUtilRingBuffer *rbuf, ring_buffer_size_t elementCount,
                                       void **dataPtr1, ring_buffer_size_t *sizePtr1,
                                       void **dataPtr2, ring_buffer_size_t *sizePtr2 )
{
    ring_buffer_size_t   index;
    ring_buffer_size_t   available = PaUtil_GetRingBufferWriteAvailable( rbuf );
    if( elementCount > available ) elementCount = available;
    /* Check to see if write is not contiguous. */
    index = rbuf->writeIndex & rbuf->smallMask;
    if( (index + elementCount) > rbuf->bufferSize )
    {
        /* Write data in two blocks that wrap the buffer. */
        ring_buffer_size_t   firstHalf = rbuf->bufferSize - index;
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = firstHalf;
        *dataPtr2 = &rbuf->buffer[0];
        *sizePtr2 = elementCount - firstHalf;
    }
    else
    {
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = elementCount;
        *dataPtr2 = NULL;
        *sizePtr2 = 0;
    }

    if( available )
        PaUtil_FullMemoryBarrier(); /* (write-after-read) => full barrier */

    return elementCount;
}